

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void test_ranges_impl<trng::yarn3s,double>(void)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  ExprLhs<bool> EVar1;
  ExprLhs<bool> EVar2;
  ExprLhs<bool> EVar3;
  StringRef SVar4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  double x_max;
  double x_min;
  generator_max<trng::yarn3s> r_max;
  generator_min<trng::yarn3s> r_min;
  undefined4 in_stack_fffffffffffffdc8;
  Flags in_stack_fffffffffffffdcc;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdd9;
  undefined1 in_stack_fffffffffffffdda;
  undefined1 in_stack_fffffffffffffddb;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffddc;
  undefined1 in_stack_fffffffffffffddd;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  AssertionHandler *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  generator_max<trng::yarn3s> *in_stack_fffffffffffffdf0;
  ExprLhs<bool> *in_stack_fffffffffffffdf8;
  AssertionHandler *in_stack_fffffffffffffe00;
  AssertionHandler *this;
  SourceLineInfo local_190;
  StringRef local_180;
  undefined1 local_121;
  SourceLineInfo local_110;
  StringRef local_100;
  undefined1 local_91;
  SourceLineInfo local_80;
  StringRef local_70;
  double local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = 0.0;
  local_10 = trng::utility::u01xx_traits<double,_1UL,_generator_min<trng::yarn3s>_>::cc
                       ((generator_min<trng::yarn3s> *)in_stack_fffffffffffffdf0);
  local_18 = trng::utility::u01xx_traits<double,_1UL,_generator_max<trng::yarn3s>_>::cc
                       (in_stack_fffffffffffffdf0);
  local_70 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffdd7,
                                         CONCAT16(in_stack_fffffffffffffdd6,
                                                  in_stack_fffffffffffffdd0)),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x88);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffde0,
             (char *)CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT15(in_stack_fffffffffffffddd,
                                                CONCAT14(in_stack_fffffffffffffddc,
                                                         CONCAT13(in_stack_fffffffffffffddb,
                                                                  CONCAT12(in_stack_fffffffffffffdda
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffdd9,
                                                  in_stack_fffffffffffffdd8))))))));
  SVar4.m_size = (size_type)in_stack_fffffffffffffdf0;
  SVar4.m_start = in_stack_fffffffffffffde8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffde0,
             (StringRef *)
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT15(in_stack_fffffffffffffddd,
                                        CONCAT14(in_stack_fffffffffffffddc,
                                                 CONCAT13(in_stack_fffffffffffffddb,
                                                          CONCAT12(in_stack_fffffffffffffdda,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffdd9,
                                                  in_stack_fffffffffffffdd8))))))),
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),SVar4,
             in_stack_fffffffffffffdcc);
  uVar7 = 0.0 <= local_10 && local_18 <= 1.0;
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     false);
  local_91 = EVar1;
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  local_10 = trng::utility::u01xx_traits<double,_1UL,_generator_min<trng::yarn3s>_>::co
                       ((generator_min<trng::yarn3s> *)
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  local_18 = trng::utility::u01xx_traits<double,_1UL,_generator_max<trng::yarn3s>_>::co
                       ((generator_max<trng::yarn3s> *)
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  local_100 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffdd7,
                                          CONCAT16(in_stack_fffffffffffffdd6,
                                                   in_stack_fffffffffffffdd0)),
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x8b);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffde0,
             (char *)CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT15(uVar7,CONCAT14(EVar1.m_lhs,
                                                               CONCAT13(in_stack_fffffffffffffddb,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffdda,
                                                  CONCAT11(in_stack_fffffffffffffdd9,
                                                           in_stack_fffffffffffffdd8))))))));
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffdf0;
  capturedExpression.m_start = in_stack_fffffffffffffde8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffde0,
             (StringRef *)
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT15(uVar7,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(in_stack_fffffffffffffddb,
                                                                CONCAT12(in_stack_fffffffffffffdda,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffdd9,
                                                  in_stack_fffffffffffffdd8))))))),
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
             capturedExpression,in_stack_fffffffffffffdcc);
  uVar6 = 0.0 <= local_10 && local_18 < 1.0;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     false);
  local_121 = EVar2;
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  local_10 = trng::utility::u01xx_traits<double,_1UL,_generator_min<trng::yarn3s>_>::oc
                       ((generator_min<trng::yarn3s> *)0x2ba243);
  local_18 = trng::utility::u01xx_traits<double,_1UL,_generator_max<trng::yarn3s>_>::oc
                       ((generator_max<trng::yarn3s> *)0x2ba259);
  local_180 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffdd7,
                                          CONCAT16(in_stack_fffffffffffffdd6,
                                                   in_stack_fffffffffffffdd0)),
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x8e);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffde0,
             (char *)CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT15(uVar7,CONCAT14(EVar1.m_lhs,
                                                               CONCAT13(uVar6,CONCAT12(EVar2.m_lhs,
                                                                                       CONCAT11(
                                                  in_stack_fffffffffffffdd9,
                                                  in_stack_fffffffffffffdd8))))))));
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffdf0;
  capturedExpression_00.m_start = in_stack_fffffffffffffde8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffde0,
             (StringRef *)
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT15(uVar7,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar6,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(
                                                  in_stack_fffffffffffffdd9,
                                                  in_stack_fffffffffffffdd8))))))),
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
             capturedExpression_00,in_stack_fffffffffffffdcc);
  uVar5 = 0.0 < local_10 && local_18 <= 1.0;
  EVar3 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  local_10 = trng::utility::u01xx_traits<double,_1UL,_generator_min<trng::yarn3s>_>::oo
                       ((generator_min<trng::yarn3s> *)
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  local_18 = trng::utility::u01xx_traits<double,_1UL,_generator_max<trng::yarn3s>_>::oo
                       ((generator_max<trng::yarn3s> *)
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  SVar4 = operator____catch_sr
                    ((char *)CONCAT17(in_stack_fffffffffffffdd7,
                                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0))
                     ,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  this = (AssertionHandler *)SVar4.m_start;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&stack0xfffffffffffffdf0,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x91);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffde0,
             (char *)CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT15(uVar7,CONCAT14(EVar1.m_lhs,
                                                               CONCAT13(uVar6,CONCAT12(EVar2.m_lhs,
                                                                                       CONCAT11(
                                                  uVar5,EVar3.m_lhs))))))));
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffdf0;
  capturedExpression_01.m_start = in_stack_fffffffffffffde8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffde0,
             (StringRef *)
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT15(uVar7,CONCAT14(EVar1.m_lhs,
                                                       CONCAT13(uVar6,CONCAT12(EVar2.m_lhs,
                                                                               CONCAT11(uVar5,EVar3.
                                                  m_lhs))))))),
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
             capturedExpression_01,in_stack_fffffffffffffdcc);
  uVar5 = 0.0 < local_10 && local_18 < 1.0;
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(this,in_stack_fffffffffffffdf8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar5,CONCAT16(EVar1.m_lhs,in_stack_fffffffffffffdd0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar5,CONCAT16(EVar1.m_lhs,in_stack_fffffffffffffdd0)));
  return;
}

Assistant:

void test_ranges_impl() {
  generator_min<R> r_min;
  generator_max<R> r_max;
  using u01xx_min = trng::utility::u01xx_traits<T, 1, generator_min<R>>;
  using u01xx_max = trng::utility::u01xx_traits<T, 1, generator_max<R>>;
  T x_min{}, x_max{};
  x_min = u01xx_min::cc(r_min);
  x_max = u01xx_max::cc(r_max);
  REQUIRE((x_min >= 0 and x_max <= 1));
  x_min = u01xx_min::co(r_min);
  x_max = u01xx_max::co(r_max);
  REQUIRE((x_min >= 0 and x_max < 1));
  x_min = u01xx_min::oc(r_min);
  x_max = u01xx_max::oc(r_max);
  REQUIRE((x_min > 0 and x_max <= 1));
  x_min = u01xx_min::oo(r_min);
  x_max = u01xx_max::oo(r_max);
  REQUIRE((x_min > 0 and x_max < 1));
}